

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

MacroFormalArgumentSyntax * __thiscall
slang::parsing::Preprocessor::MacroParser::parseFormalArgument(MacroParser *this)

{
  BumpAllocator *this_00;
  bool bVar1;
  MacroFormalArgumentSyntax *pMVar2;
  Token TVar3;
  MacroArgumentDefaultSyntax *argDef;
  Token local_48;
  span<slang::parsing::Token,_18446744073709551615UL> local_38;
  Token equals;
  
  local_48 = peek(this);
  if (local_48.kind != Identifier) {
    bVar1 = LexerFacts::isKeyword(local_48.kind);
    if (!bVar1) {
      local_48 = expect(this,Identifier);
      goto LAB_00266844;
    }
  }
  consume(this);
LAB_00266844:
  argDef = (MacroArgumentDefaultSyntax *)0x0;
  TVar3 = peek(this);
  if (TVar3.kind == Equals) {
    equals = consume(this);
    this_00 = this->pp->alloc;
    local_38 = parseTokenList(this,false);
    argDef = BumpAllocator::
             emplace<slang::syntax::MacroArgumentDefaultSyntax,slang::parsing::Token&,std::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_00,&equals,&local_38);
  }
  pMVar2 = BumpAllocator::
           emplace<slang::syntax::MacroFormalArgumentSyntax,slang::parsing::Token&,slang::syntax::MacroArgumentDefaultSyntax*&>
                     (this->pp->alloc,&local_48,&argDef);
  return pMVar2;
}

Assistant:

MacroFormalArgumentSyntax* Preprocessor::MacroParser::parseFormalArgument() {
    Token arg = peek();
    if (arg.kind == TokenKind::Identifier || LF::isKeyword(arg.kind))
        consume();
    else
        arg = expect(TokenKind::Identifier);

    MacroArgumentDefaultSyntax* argDef = nullptr;
    if (peek(TokenKind::Equals)) {
        auto equals = consume();
        argDef = pp.alloc.emplace<MacroArgumentDefaultSyntax>(equals, parseTokenList(false));
    }

    return pp.alloc.emplace<MacroFormalArgumentSyntax>(arg, argDef);
}